

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedChargeAdapter.cpp
# Opt level: O0

FixedChargeAtypeParameters __thiscall
OpenMD::FixedChargeAdapter::getFixedChargeParam(FixedChargeAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  FixedChargeAtypeParameters *pFVar3;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> fcData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff40;
  errorStruct *peVar4;
  AtomType *in_stack_ffffffffffffff48;
  string local_a0 [64];
  undefined1 local_60 [88];
  pointer local_8;
  
  bVar1 = isFixedCharge((FixedChargeAdapter *)0x268c31);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam was passed an atomType (%s)\n\tthat does not appear to be a fixed charge atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff48 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam could not find fixed charge\n\tparameters for atomType %s.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff48);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  std::
  dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> *
                          )in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    peVar4 = &painCave;
    snprintf(painCave.errMsg,2000,
             "FixedChargeAdapter::getFixedChargeParam could not convert\n\tGenericData to FixedChargeAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar4->severity = 1;
    peVar4->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x268e20);
  pFVar3 = SimpleTypeData<OpenMD::FixedChargeAtypeParameters>::getData(this_00);
  local_8 = (pointer)pFVar3->charge;
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::FixedChargeAtypeParameters>_> *)0x268e49);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x268e56);
  return (FixedChargeAtypeParameters)(RealType)local_8;
}

Assistant:

FixedChargeAtypeParameters FixedChargeAdapter::getFixedChargeParam() {
    if (!isFixedCharge()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam was passed an atomType "
               "(%s)\n"
               "\tthat does not appear to be a fixed charge atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(FCtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not find fixed "
               "charge\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<FixedChargeAtypeData> fcData =
        std::dynamic_pointer_cast<FixedChargeAtypeData>(data);
    if (fcData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "FixedChargeAdapter::getFixedChargeParam could not convert\n"
               "\tGenericData to FixedChargeAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return fcData->getData();
  }